

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::removeRows(SPxLPBase<double> *this,SPxRowId *id,int n,int *perm)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  DataKey *k;
  bool bVar4;
  DataArray<int> p;
  DataArray<int> DStack_48;
  
  if (perm != (int *)0x0) {
    uVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    while (0 < (int)uVar1) {
      uVar1 = uVar1 - 1;
      perm[uVar1] = uVar1;
    }
    lVar3 = (long)n;
    k = &id[lVar3].super_DataKey;
    while( true ) {
      k = k + -1;
      bVar4 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar4) break;
      iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                        (&(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set,k);
      perm[iVar2] = -1;
    }
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(this,perm);
    return;
  }
  DataArray<int>::DataArray
            (&DStack_48,(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,0,1.2)
  ;
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x12])
            (this,id,(ulong)(uint)n,DStack_48.data);
  DataArray<int>::~DataArray(&DStack_48);
  return;
}

Assistant:

virtual void removeRows(SPxRowId id[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(id, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[number(id[n])] = -1;

      removeRows(perm);
   }